

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

void __thiscall smf::MidiMessage::setVelocity(MidiMessage *this,int value)

{
  bool bVar1;
  
  bVar1 = isNote(this);
  if (bVar1) {
    if (*(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start < 3) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
    }
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)value;
  }
  return;
}

Assistant:

void MidiMessage::setVelocity(int value) {
	if (isNote()) {
		setP2(value & 0xff);
	} else {
		// don't do anything since this is not a note-related message.
	}
}